

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O0

bool __thiscall protozero::pbf_reader::get_bool(pbf_reader *this)

{
  char cVar1;
  bool bVar2;
  pbf_tag_type pVar3;
  assert_error *paVar4;
  bool result;
  pbf_reader *this_local;
  
  pVar3 = tag(this);
  if (pVar3 == 0) {
    paVar4 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar4,"tag() != 0 && \"call next() before accessing field value\"");
    __cxa_throw(paVar4,&assert_error::typeinfo,assert_error::~assert_error);
  }
  bVar2 = has_wire_type(this,varint);
  if (!bVar2) {
    paVar4 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar4,"has_wire_type(pbf_wire_type::varint) && \"not a varint\"");
    __cxa_throw(paVar4,&assert_error::typeinfo,assert_error::~assert_error);
  }
  cVar1 = *this->m_data;
  skip_varint(&this->m_data,this->m_end);
  return cVar1 != '\0';
}

Assistant:

bool get_bool() {
        protozero_assert(tag() != 0 && "call next() before accessing field value");
        protozero_assert(has_wire_type(pbf_wire_type::varint) && "not a varint");
        const bool result = m_data[0] != 0;
        skip_varint(&m_data, m_end);
        return result;
    }